

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O1

void TTD::NSLogEvents::JsRTCallFunctionAction_ProcessDiagInfoPre
               (EventLogEntry *evt,Var funcVar,UnlinkableSlabAllocator *alloc)

{
  bool bVar1;
  charcount_t length;
  JavascriptFunction *this;
  JavascriptString *this_00;
  char16_t *str;
  size_t sVar2;
  
  if (evt->EventKind == CallExistingFunctionActionTag) {
    bVar1 = Js::VarIs<Js::JavascriptFunction>(funcVar);
    if (bVar1) {
      this = Js::VarTo<Js::JavascriptFunction>(funcVar);
      this_00 = Js::JavascriptFunction::GetDisplayName(this);
      str = Js::JavascriptString::GetString(this_00);
      length = Js::JavascriptString::GetLength(this_00);
    }
    else {
      sVar2 = PAL_wcslen(L"#not a function#");
      str = L"#not a function#";
      length = (charcount_t)sVar2;
    }
    SlabAllocatorBase<8>::CopyStringIntoWLength(alloc,str,length,(TTString *)&evt[4].EventTimeStamp)
    ;
    evt[4].EventKind = ~Invalid;
    evt[4].ResultStatus = 0x7fffffff;
    return;
  }
  TTDAbort_unrecoverable_error("Bad tag match!");
}

Assistant:

void JsRTCallFunctionAction_ProcessDiagInfoPre(EventLogEntry* evt, Js::Var funcVar, UnlinkableSlabAllocator& alloc)
        {
            JsRTCallFunctionAction* cfAction = GetInlineEventDataAs<JsRTCallFunctionAction, EventKind::CallExistingFunctionActionTag>(evt);

            if(Js::VarIs<Js::JavascriptFunction>(funcVar))
            {
                Js::JavascriptString* displayName = Js::VarTo<Js::JavascriptFunction>(funcVar)->GetDisplayName();
                alloc.CopyStringIntoWLength(displayName->GetString(), displayName->GetLength(), cfAction->FunctionName);
            }
            else
            {
                alloc.CopyNullTermStringInto(_u("#not a function#"), cfAction->FunctionName);
            }

            //In case we don't terminate add these nicely
            cfAction->LastNestedEvent = TTD_EVENT_MAXTIME;
        }